

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscrete.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete
          (MultiAgentDecisionProcessDiscrete *this,MultiAgentDecisionProcessDiscrete *a)

{
  void *pvVar1;
  long *in_RSI;
  void **in_RDI;
  MultiAgentDecisionProcessDiscreteInterface *this_00;
  MADPComponentDiscreteActions *in_stack_ffffffffffffff98;
  MADPComponentDiscreteActions *in_stack_ffffffffffffffa0;
  pointer_____offset_0x48___ *ppuVar2;
  MultiAgentDecisionProcess *in_stack_ffffffffffffffe0;
  
  this_00 = (MultiAgentDecisionProcessDiscreteInterface *)(in_RDI + 0x40);
  MultiAgentDecisionProcessInterface::MultiAgentDecisionProcessInterface
            ((MultiAgentDecisionProcessInterface *)this_00);
  ppuVar2 = &VTT;
  MultiAgentDecisionProcessDiscreteInterface::MultiAgentDecisionProcessDiscreteInterface
            (this_00,&PTR_PTR_00d36168,
             (MultiAgentDecisionProcessDiscreteInterface *)
             ((long)in_RSI + *(long *)(*in_RSI + -0x48)));
  MultiAgentDecisionProcess::MultiAgentDecisionProcess
            (in_stack_ffffffffffffffe0,in_RDI,(MultiAgentDecisionProcess *)ppuVar2);
  *in_RDI = vtable + 0x48;
  in_RDI[0x40] = vtable + 0x340;
  in_RDI[0x40] = vtable + 0x340;
  MADPComponentDiscreteStates::MADPComponentDiscreteStates
            ((MADPComponentDiscreteStates *)in_stack_ffffffffffffffa0);
  MADPComponentDiscreteActions::MADPComponentDiscreteActions(in_stack_ffffffffffffffa0);
  MADPComponentDiscreteObservations::MADPComponentDiscreteObservations
            ((MADPComponentDiscreteObservations *)in_stack_ffffffffffffffa0);
  MADPComponentDiscreteStates::operator=
            ((MADPComponentDiscreteStates *)in_stack_ffffffffffffffa0,
             (MADPComponentDiscreteStates *)in_stack_ffffffffffffff98);
  MADPComponentDiscreteActions::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  MADPComponentDiscreteObservations::operator=
            ((MADPComponentDiscreteObservations *)in_stack_ffffffffffffffa0,
             (MADPComponentDiscreteObservations *)in_stack_ffffffffffffff98);
  *(byte *)(in_RDI + 0x3c) = *(byte *)(in_RSI + 0x3c) & 1;
  *(byte *)((long)in_RDI + 0x1e1) = *(byte *)((long)in_RSI + 0x1e1) & 1;
  *(byte *)((long)in_RDI + 0x1e2) = *(byte *)((long)in_RSI + 0x1e2) & 1;
  pvVar1 = (void *)(**(code **)(*(long *)in_RSI[0x3d] + 0x10))();
  in_RDI[0x3d] = pvVar1;
  pvVar1 = (void *)(**(code **)(*(long *)in_RSI[0x3e] + 0x10))();
  in_RDI[0x3e] = pvVar1;
  *(int *)(in_RDI + 0x3f) = (int)in_RSI[0x3f];
  return;
}

Assistant:

MultiAgentDecisionProcessDiscrete::MultiAgentDecisionProcessDiscrete(
    const MultiAgentDecisionProcessDiscrete& a) :
    MultiAgentDecisionProcessDiscreteInterface(a),
    MultiAgentDecisionProcess(a)
{
    _m_S=a._m_S;
    _m_A=a._m_A;
    _m_O=a._m_O;
    _m_initialized=a._m_initialized;
    _m_sparse=a._m_sparse;
    _m_eventObservability=a._m_eventObservability;
    _m_p_tModel=a._m_p_tModel->Clone();
    _m_p_oModel=a._m_p_oModel->Clone();
    _m_falseNegativeObs = a._m_falseNegativeObs;
}